

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaper.cpp
# Opt level: O3

void __thiscall zmq::reaper_t::in_event(reaper_t *this)

{
  int iVar1;
  __pid_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  char *errmsg_;
  char *in_RCX;
  undefined8 in_R8;
  command_t cmd;
  command_t local_c0 [2];
  
  iVar1 = this->_pid;
  _Var2 = getpid();
  if (iVar1 == _Var2) {
    do {
      sVar3 = mailbox_t::recv(&this->_mailbox,(int)local_c0,(void *)0x0,(size_t)in_RCX,(int)in_R8);
      if ((int)sVar3 == 0) {
LAB_001205c3:
        object_t::process_command(local_c0[0].destination,local_c0);
      }
      else {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        if (iVar1 != 4) {
          if (iVar1 == 0xb) {
            return;
          }
          errmsg_ = strerror(iVar1);
          in_RCX = 
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/reaper.cpp"
          ;
          in_R8 = 0x65;
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_);
          fflush(_stderr);
          zmq_abort(errmsg_);
          goto LAB_001205c3;
        }
      }
      iVar1 = this->_pid;
      _Var2 = getpid();
    } while (iVar1 == _Var2);
  }
  return;
}

Assistant:

void zmq::reaper_t::in_event ()
{
    while (true) {
#ifdef HAVE_FORK
        if (unlikely (_pid != getpid ())) {
            //printf("zmq::reaper_t::in_event return in child process %d\n", (int)getpid());
            return;
        }
#endif

        //  Get the next command. If there is none, exit.
        command_t cmd;
        const int rc = _mailbox.recv (&cmd, 0);
        if (rc != 0 && errno == EINTR)
            continue;
        if (rc != 0 && errno == EAGAIN)
            break;
        errno_assert (rc == 0);

        //  Process the command.
        cmd.destination->process_command (cmd);
    }
}